

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeFilteringCase::iterate(TextureCubeFilteringCase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  TestLog *log;
  RenderContext *context;
  TextureCube *pTVar2;
  ConstPixelBufferAccess *pCVar3;
  pointer pFVar4;
  ConstPixelBufferAccess *pCVar5;
  int y;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  uint uVar10;
  CubeFace face;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NotSupportedError *this_01;
  byte bVar12;
  char *description;
  qpTestResult testResult;
  TestContext *pTVar13;
  pointer pFVar14;
  TextureCube *format;
  undefined1 auVar15 [16];
  RandomViewport viewport;
  LodPrecision lodPrecision;
  PixelFormat pixelFormat;
  vector<float,_std::allocator<float>_> texCoord;
  int *local_350;
  ScopedLogSection iterSection;
  undefined1 local_338 [24];
  undefined8 local_320;
  ConstPixelBufferAccess *pCStack_318;
  BVec4 local_310;
  Surface result;
  ConstPixelBufferAccess local_2c8;
  IVec4 colorBits;
  undefined1 local_290 [76];
  ConstPixelBufferAccess *pCStack_244;
  ConstPixelBufferAccess *local_23c;
  ConstPixelBufferAccess *pCStack_234;
  int local_22c;
  bool local_218;
  undefined7 uStack_217;
  LodMode local_210;
  TextureFormatInfo fmtInfo;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  int local_198;
  anon_union_16_3_1194ccdc_for_v aStack_194;
  undefined4 uStack_184;
  DepthStencilMode DStack_180;
  long lVar11;
  
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar8 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  dVar9 = deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar7),0x1c,0x1c,dVar8 ^ dVar9);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_290,"Test",(allocator<char> *)&texCoord);
  de::toString<int>((string *)&fmtInfo,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fmtInfo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"Test ",(allocator<char> *)&pixelFormat);
  de::toString<int>((string *)&result,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
  tcu::ScopedLogSection::ScopedLogSection(&iterSection,log,(string *)local_1b8,(string *)local_338);
  std::__cxx11::string::~string((string *)local_338);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&fmtInfo);
  std::__cxx11::string::~string((string *)local_290);
  iVar7 = this->m_caseNdx;
  pFVar14 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  format = &(pFVar14[iVar7].texture)->m_refTexture;
  tcu::getTextureFormatInfo(&fmtInfo,&format->m_format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_290,TEXTURETYPE_CUBE);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small render target",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x23b);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pFVar14 = pFVar14 + iVar7;
  (**(code **)(lVar11 + 0xb8))(0x8513,pFVar14->texture->m_glTexture);
  (**(code **)(lVar11 + 0x1360))(0x8513,0x2801,this->m_minFilter);
  (**(code **)(lVar11 + 0x1360))(0x8513,0x2800,this->m_magFilter);
  (**(code **)(lVar11 + 0x1360))(0x8513,0x2802,this->m_wrapS);
  (**(code **)(lVar11 + 0x1360))(0x8513,0x2803,this->m_wrapT);
  (**(code **)(lVar11 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  glu::mapGLSampler((Sampler *)local_1b8,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  local_22c = local_198;
  local_23c = (ConstPixelBufferAccess *)local_1a8._M_allocated_capacity;
  pCStack_234 = (ConstPixelBufferAccess *)local_1a8._8_8_;
  local_290._68_8_ = local_1b8._0_8_;
  pCStack_244 = (ConstPixelBufferAccess *)local_1b8._8_8_;
  uStack_217 = (undefined7)(CONCAT44(DStack_180,uStack_184) >> 8);
  local_218 = true;
  local_290._4_4_ = glu::TextureTestUtil::getSamplerType(format->m_format);
  local_290._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_290._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_290._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_290._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_290._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_290._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_290._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_290._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_210 = LODMODE_EXACT;
  local_1b8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Coordinates: ");
  tcu::operator<<((ostream *)poVar1,&pFVar14->bottomLeft);
  std::operator<<((ostream *)poVar1," -> ");
  tcu::operator<<((ostream *)poVar1,&pFVar14->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1b8 + 8);
  face = CUBEFACE_NEGATIVE_X;
  local_350 = &DAT_009b7bd4;
  do {
    if (face == CUBEFACE_LAST) {
      iVar7 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar7;
      pFVar14 = (this->m_cases).
                super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pFVar4 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tcu::ScopedLogSection::~ScopedLogSection(&iterSection);
      return (IterateResult)(iVar7 < (int)(((long)pFVar14 - (long)pFVar4) / 0x18));
    }
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar14->bottomLeft,&pFVar14->topRight);
    local_1b8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Face ");
    std::operator<<((ostream *)poVar1,(char *)((long)&DAT_009b7bd4 + (long)*local_350));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_290);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                    ,0x25e);
    y = viewport.y;
    iVar7 = viewport.x;
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b8,&result);
    glu::readPixels(context,iVar7,y,(PixelBufferAccess *)local_1b8);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                    ,0x261);
    dVar8 = this->m_minFilter;
    dVar9 = this->m_magFilter;
    iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 0x10);
    local_338._8_4_ = pixelFormat.blueBits;
    local_338._12_4_ = pixelFormat.alphaBits;
    local_338._0_8_ = pixelFormat._0_8_;
    tcu::operator-((tcu *)local_1b8,(Vector<int,_4> *)local_338,
                   (dVar9 != 0x2600 || dVar8 != 0x2600) + 1);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_2c8,0);
    tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_1b8,(Vector<int,_4> *)&local_2c8);
    this_00 = (ostringstream *)(local_1b8 + 8);
    lodPrecision.rule = RULE_OPENGL;
    lodPrecision.derivateBits = 0x16;
    lodPrecision.lodBits = 0x10;
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_338);
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)&local_2c8,&colorBits);
    tcu::operator/((tcu *)local_1b8,(Vector<float,_4> *)&local_2c8,
                   (Vector<float,_4> *)(local_290 + 0x24));
    local_320 = local_1b8._0_8_;
    pCStack_318 = (ConstPixelBufferAccess *)local_1b8._8_8_;
    local_338._0_8_ = (pointer)0xa0000000a;
    local_338._8_4_ = 10;
    local_338._12_4_ = 6;
    local_338._16_4_ = 6;
    local_338._20_4_ = 0;
    auVar15._0_4_ = -(uint)(0 < pixelFormat.redBits);
    auVar15._4_4_ = -(uint)(0 < pixelFormat.greenBits);
    auVar15._8_4_ = -(uint)(0 < pixelFormat.blueBits);
    auVar15._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
    uVar10 = movmskps((int)&local_320,auVar15);
    bVar12 = (byte)uVar10;
    local_310.m_data =
         (bool  [4])
         (uVar10 & 1 | (uint)((bVar12 & 2) >> 1) << 8 | (uint)((bVar12 & 4) >> 2) << 0x10 |
         (uint)(bVar12 >> 3) << 0x18);
    pTVar13 = (this->super_TestCase).super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2c8,&result);
    pTVar2 = pFVar14->texture;
    pCVar3 = (pTVar2->m_refTexture).m_view.m_levels[5];
    aStack_194.uData[3] = (deUint32)pCVar3;
    uStack_184 = (undefined4)((ulong)pCVar3 >> 0x20);
    local_1b8._0_4_ = (pTVar2->m_refTexture).m_view.m_numLevels;
    local_1b8._4_4_ = *(ChannelType *)&(pTVar2->m_refTexture).m_view.field_0x4;
    local_1b8._8_8_ = (pTVar2->m_refTexture).m_view.m_levels[0];
    local_1a8._M_allocated_capacity = (size_type)(pTVar2->m_refTexture).m_view.m_levels[1];
    local_1a8._8_8_ = (pTVar2->m_refTexture).m_view.m_levels[2];
    pCVar3 = (pTVar2->m_refTexture).m_view.m_levels[3];
    pCVar5 = (pTVar2->m_refTexture).m_view.m_levels[4];
    local_198 = (int)pCVar3;
    aStack_194.uData[0] = (deUint32)((ulong)pCVar3 >> 0x20);
    aStack_194.uData[1] = (deUint32)pCVar5;
    aStack_194.uData[2] = (deUint32)((ulong)pCVar5 >> 0x20);
    bVar6 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar13,&local_2c8,(TextureCubeView *)local_1b8,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_290,
                       (LookupPrecision *)local_338,&lodPrecision,&pixelFormat);
    if (!bVar6) {
      local_338._12_4_ = 4;
      local_338._16_4_ = 4;
      local_338._20_4_ = 0;
      lodPrecision.lodBits = 4;
      local_1b8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Warning: Verification against high precision requirements failed, trying with lower requirements."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      pTVar13 = (this->super_TestCase).super_TestNode.m_testCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)&local_2c8,&result);
      pTVar2 = pFVar14->texture;
      pCVar3 = (pTVar2->m_refTexture).m_view.m_levels[5];
      aStack_194.uData[3] = (deUint32)pCVar3;
      uStack_184 = (undefined4)((ulong)pCVar3 >> 0x20);
      local_1b8._0_4_ = (pTVar2->m_refTexture).m_view.m_numLevels;
      local_1b8._4_4_ = *(ChannelType *)&(pTVar2->m_refTexture).m_view.field_0x4;
      local_1b8._8_8_ = (pTVar2->m_refTexture).m_view.m_levels[0];
      local_1a8._M_allocated_capacity = (size_type)(pTVar2->m_refTexture).m_view.m_levels[1];
      local_1a8._8_8_ = (pTVar2->m_refTexture).m_view.m_levels[2];
      pCVar3 = (pTVar2->m_refTexture).m_view.m_levels[3];
      pCVar5 = (pTVar2->m_refTexture).m_view.m_levels[4];
      local_198 = (int)pCVar3;
      aStack_194.uData[0] = (deUint32)((ulong)pCVar3 >> 0x20);
      aStack_194.uData[1] = (deUint32)pCVar5;
      aStack_194.uData[2] = (deUint32)((ulong)pCVar5 >> 0x20);
      bVar6 = glu::TextureTestUtil::verifyTextureResult
                        (pTVar13,&local_2c8,(TextureCubeView *)local_1b8,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_290,
                         (LookupPrecision *)local_338,&lodPrecision,&pixelFormat);
      if (bVar6) {
        pTVar13 = (this->super_TestCase).super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        description = "Low-quality filtering result";
        if (pTVar13->m_testResult != QP_TEST_RESULT_PASS) goto LAB_00569999;
      }
      else {
        local_1b8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
        std::operator<<((ostream *)(local_1b8 + 8),
                        "ERROR: Verification against low precision requirements failed, failing test case."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        pTVar13 = (this->super_TestCase).super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar13,testResult,description);
    }
LAB_00569999:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    local_350 = local_350 + 1;
  } while( true );
}

Assistant:

TextureCubeFilteringCase::IterateResult TextureCubeFilteringCase::iterate (void)
{
	const glw::Functions&			gl				= m_renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_renderCtx.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat&		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.samplerType				= getSamplerType(texFmt);
	sampleParams.colorBias					= fmtInfo.lookupBias;
	sampleParams.colorScale					= fmtInfo.lookupScale;
	sampleParams.lodMode					= LODMODE_EXACT;

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / sampleParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}